

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Music_Emu::skip_(Music_Emu *this,long count)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  blargg_err_t unaff_R14;
  blargg_err_t pcVar4;
  
  if (30000 < count) {
    uVar1 = this->mute_mask_;
    this->mute_mask_ = -1;
    (*(this->super_Gme_File)._vptr_Gme_File[0xd])(this,0xffffffff);
    do {
      lVar5 = count;
      if (this->emu_track_ended_ != false) break;
      iVar3 = (*(this->super_Gme_File)._vptr_Gme_File[0x10])(this,0x800,(this->buf).begin_);
      pcVar4 = (blargg_err_t)CONCAT44(extraout_var,iVar3);
      if (pcVar4 != (blargg_err_t)0x0) {
        bVar2 = false;
        goto LAB_006b4e09;
      }
      lVar5 = count + -0x800;
      bVar2 = 0x4298 < count;
      count = lVar5;
    } while (bVar2);
    this->mute_mask_ = uVar1;
    (*(this->super_Gme_File)._vptr_Gme_File[0xd])(this,(ulong)uVar1);
    bVar2 = true;
    pcVar4 = unaff_R14;
    count = lVar5;
LAB_006b4e09:
    if (!bVar2) {
      return pcVar4;
    }
  }
  do {
    if ((count == 0) || (this->emu_track_ended_ != false)) {
      return (blargg_err_t)0x0;
    }
    lVar5 = 0x800;
    if (count < 0x800) {
      lVar5 = count;
    }
    count = count - lVar5;
    iVar3 = (*(this->super_Gme_File)._vptr_Gme_File[0x10])(this,lVar5,(this->buf).begin_);
  } while ((blargg_err_t)CONCAT44(extraout_var_00,iVar3) == (blargg_err_t)0x0);
  return (blargg_err_t)CONCAT44(extraout_var_00,iVar3);
}

Assistant:

blargg_err_t Music_Emu::skip_( long count )
{
	// for long skip, mute sound
	const long threshold = 30000;
	if ( count > threshold )
	{
		int saved_mute = mute_mask_;
		mute_voices( ~0 );
		
		while ( count > threshold / 2 && !emu_track_ended_ )
		{
			RETURN_ERR( play_( buf_size, buf.begin() ) );
			count -= buf_size;
		}
		
		mute_voices( saved_mute );
	}
	
	while ( count && !emu_track_ended_ )
	{
		long n = buf_size;
		if ( n > count )
			n = count;
		count -= n;
		RETURN_ERR( play_( n, buf.begin() ) );
	}
	return 0;
}